

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int growVTrans(sqlite3 *db)

{
  VTable **ppVVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  if (db->nVTrans % 5 == 0) {
    ppVVar1 = (VTable **)sqlite3DbRealloc(db,db->aVTrans,(long)db->nVTrans * 8 + 0x28);
    if (ppVVar1 == (VTable **)0x0) {
      iVar3 = 7;
    }
    else {
      lVar2 = (long)db->nVTrans;
      ppVVar1[lVar2 + 2] = (VTable *)0x0;
      (ppVVar1 + lVar2 + 2)[1] = (VTable *)0x0;
      ppVVar1[lVar2] = (VTable *)0x0;
      (ppVVar1 + lVar2)[1] = (VTable *)0x0;
      ppVVar1[lVar2 + 4] = (VTable *)0x0;
      db->aVTrans = ppVVar1;
    }
  }
  return iVar3;
}

Assistant:

static int growVTrans(sqlite3 *db){
  const int ARRAY_INCR = 5;

  /* Grow the sqlite3.aVTrans array if required */
  if( (db->nVTrans%ARRAY_INCR)==0 ){
    VTable **aVTrans;
    sqlite3_int64 nBytes = sizeof(sqlite3_vtab*)*
                                 ((sqlite3_int64)db->nVTrans + ARRAY_INCR);
    aVTrans = sqlite3DbRealloc(db, (void *)db->aVTrans, nBytes);
    if( !aVTrans ){
      return SQLITE_NOMEM_BKPT;
    }
    memset(&aVTrans[db->nVTrans], 0, sizeof(sqlite3_vtab *)*ARRAY_INCR);
    db->aVTrans = aVTrans;
  }

  return SQLITE_OK;
}